

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O3

void __thiscall dg::vr::StructureAnalyzer::categorizeEdges(StructureAnalyzer *this)

{
  VREdge *pVVar1;
  VRLocation *pVVar2;
  __uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_> _Var3;
  VRLocation *loc;
  char cVar4;
  bool bVar5;
  undefined4 uVar6;
  pointer puVar7;
  tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*> *elem;
  pointer ptVar8;
  long lVar9;
  Function *f;
  long lVar10;
  ulong uVar11;
  SimpleDFS it;
  SimpleDFS local_e0;
  DFSIt<dg::vr::VRCodeGraph::SimpleVisit> local_88;
  
  lVar10 = *(long *)(*(long *)this + 0x20);
  lVar9 = *(long *)this + 0x18;
  if (lVar10 != lVar9) {
    do {
      f = (Function *)(lVar10 + -0x38);
      if (lVar10 == 0) {
        f = (Function *)0x0;
      }
      cVar4 = llvm::GlobalValue::isDeclaration();
      if (cVar4 == '\0') {
        VRCodeGraph::dfs_begin(&local_e0,*(VRCodeGraph **)(this + 8),f);
        while( true ) {
          VRCodeGraph::dfs_end();
          bVar5 = operator==(&local_e0,&local_88);
          if (local_88.stack.
              super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.stack.
                            super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_88.stack.
                                  super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.stack.
                                  super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Rb_tree<dg::vr::VRLocation_*,_dg::vr::VRLocation_*,_std::_Identity<dg::vr::VRLocation_*>,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
          ::_M_erase((_Rb_tree<dg::vr::VRLocation_*,_dg::vr::VRLocation_*,_std::_Identity<dg::vr::VRLocation_*>,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
                      *)&local_88,
                     (_Link_type)
                     local_88.super_SimpleVisit.visited._M_t._M_impl.super__Rb_tree_header._M_header
                     ._M_parent);
          if (bVar5) break;
          pVVar1 = local_e0.stack.
                   super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].
                   super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>.
                   super__Tuple_impl<1UL,_unsigned_int,_dg::vr::VREdge_*>.
                   super__Tuple_impl<2UL,_dg::vr::VREdge_*>.
                   super__Head_base<2UL,_dg::vr::VREdge_*,_false>._M_head_impl;
          pVVar2 = local_e0.stack.
                   super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].
                   super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>.
                   super__Head_base<0UL,_dg::vr::VRLocation_*,_false>._M_head_impl;
          if (pVVar1 != (VREdge *)0x0) {
            pVVar1->type = TREE;
          }
          puVar7 = (pVVar2->successors).
                   super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((int)((ulong)((long)(pVVar2->successors).
                                  super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7) >> 3)
              != 0) {
            uVar11 = 0;
            do {
              _Var3._M_t.
              super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>.
              super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl =
                   puVar7[uVar11]._M_t.
                   super___uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>._M_t;
              loc = *(VRLocation **)
                     ((long)_Var3._M_t.
                            super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>
                            .super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl + 8);
              if (loc == (VRLocation *)0x0) {
                uVar6 = 0;
LAB_00125e16:
                *(undefined4 *)
                 ((long)_Var3._M_t.
                        super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>
                        .super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl + 0x18) = uVar6
                ;
              }
              else {
                bVar5 = VRCodeGraph::SimpleVisit::wasVisited(&local_e0.super_SimpleVisit,loc);
                if (bVar5) {
                  uVar6 = 2;
                  for (ptVar8 = local_e0.stack.
                                super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      ptVar8 != local_e0.stack.
                                super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish; ptVar8 = ptVar8 + 1) {
                    if ((ptVar8->
                        super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>
                        ).super__Head_base<0UL,_dg::vr::VRLocation_*,_false>._M_head_impl == loc) {
                      uVar6 = 1;
                      break;
                    }
                  }
                  goto LAB_00125e16;
                }
              }
              uVar11 = uVar11 + 1;
              puVar7 = (pVVar2->successors).
                       super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar11 < ((ulong)((long)(pVVar2->successors).
                                             super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)puVar7) >> 3 & 0xffffffff));
          }
          VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::operator++(&local_e0);
        }
        if (local_e0.stack.
            super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.stack.
                          super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e0.stack.
                                super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.stack.
                                super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<dg::vr::VRLocation_*,_dg::vr::VRLocation_*,_std::_Identity<dg::vr::VRLocation_*>,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
        ::_M_erase((_Rb_tree<dg::vr::VRLocation_*,_dg::vr::VRLocation_*,_std::_Identity<dg::vr::VRLocation_*>,_std::less<dg::vr::VRLocation_*>,_std::allocator<dg::vr::VRLocation_*>_>
                    *)&local_e0,
                   (_Link_type)
                   local_e0.super_SimpleVisit.visited._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent);
      }
      lVar10 = *(long *)(lVar10 + 8);
    } while (lVar10 != lVar9);
  }
  VRCodeGraph::hasCategorizedEdges(*(VRCodeGraph **)(this + 8));
  return;
}

Assistant:

void StructureAnalyzer::categorizeEdges() {
    for (const auto &function : module) {
        if (function.isDeclaration())
            continue;

        for (auto it = codeGraph.dfs_begin(function); it != codeGraph.dfs_end();
             ++it) {
            VRLocation &current = *it;
            VREdge *predEdge = it.getEdge();

            if (predEdge)
                predEdge->type = EdgeType::TREE;

            for (unsigned i = 0; i < current.succsSize(); ++i) {
                VREdge *succEdge = current.getSuccEdge(i);
                VRLocation *successor = succEdge->target;

                if (!successor)
                    succEdge->type = EdgeType::TREE;
                else if (it.wasVisited(successor)) {
                    if (it.onStack(successor))
                        succEdge->type = EdgeType::BACK;
                    else
                        succEdge->type = EdgeType::FORWARD;
                }
            }
        }
    }

    codeGraph.hasCategorizedEdges();
}